

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O0

void __thiscall ThreadRegionsBuilder::printNodes(ThreadRegionsBuilder *this,ostream *ostream)

{
  bool bVar1;
  reference ppTVar2;
  long in_RDI;
  ThreadRegion *threadRegion;
  iterator __end1;
  iterator __begin1;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *__range1;
  ostream *in_stack_00000038;
  ThreadRegion *in_stack_00000040;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
  *in_stack_ffffffffffffffc8;
  ThreadRegion *this_00;
  _Self local_28;
  _Self local_20;
  long local_18;
  
  local_18 = in_RDI + 0x70;
  local_20._M_node =
       (_Base_ptr)
       std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::end
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppTVar2 = std::_Rb_tree_const_iterator<ThreadRegion_*>::operator*
                        ((_Rb_tree_const_iterator<ThreadRegion_*> *)0x1ab8c9);
    this_00 = *ppTVar2;
    ThreadRegion::printNodes(in_stack_00000040,in_stack_00000038);
    std::_Rb_tree_const_iterator<ThreadRegion_*>::operator++
              ((_Rb_tree_const_iterator<ThreadRegion_*> *)this_00);
  }
  return;
}

Assistant:

void ThreadRegionsBuilder::printNodes(std::ostream &ostream) const {
    for (auto *threadRegion : threadRegions_) {
        threadRegion->printNodes(ostream);
    }
}